

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_cross_entropy_loss_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  
  if ((((a->ne[0] == 1) && (a->ne[1] == 1)) && (a->ne[2] == 1)) && (a->ne[3] == 1)) {
    if (((b->ne[0] == c->ne[0]) && (b->ne[1] == c->ne[1])) &&
       ((b->ne[2] == c->ne[2] && (b->ne[3] == c->ne[3])))) {
      pgVar1 = ggml_new_tensor_impl(ctx,b->type,4,b->ne,(ggml_tensor *)0x0,0);
      pgVar1->op = GGML_OP_CROSS_ENTROPY_LOSS_BACK;
      pgVar1->src[0] = a;
      pgVar1->src[1] = b;
      pgVar1->src[2] = c;
      return pgVar1;
    }
    pcVar2 = "ggml_are_same_shape(b, c)";
    line = 0x13fe;
  }
  else {
    pcVar2 = "ggml_is_scalar(a)";
    line = 0x13fd;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_cross_entropy_loss_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_scalar(a));
    GGML_ASSERT(ggml_are_same_shape(b, c));

    struct ggml_tensor * result = ggml_dup_tensor(ctx, b);

    result->op     = GGML_OP_CROSS_ENTROPY_LOSS_BACK;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}